

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::DeclareStmt::~DeclareStmt(DeclareStmt *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__DeclareStmt_001696a8;
  ppIVar1 = (this->varList).
            super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->varList).
                 super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (Identifier *)0x0) {
      (*((*ppIVar2)->super_Expr).super_Node._vptr_Node[1])();
    }
  }
  ppIVar2 = (this->varList).
            super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->varList).super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppIVar2) {
    (this->varList).super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppIVar2;
  }
  std::_Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::~_Vector_base
            (&(this->varList).
              super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>);
  token::Token::~Token(&this->tok);
  return;
}

Assistant:

~DeclareStmt(){
        for(auto ident : varList){
            delete ident;
        }
        varList.clear();
    }